

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LedgerFormats.cpp
# Opt level: O2

void __thiscall jbcoin::LedgerFormats::addCommonFields(LedgerFormats *this,Item *item)

{
  SOElement local_38;
  SOElement local_28;
  SOElement local_18;
  
  local_18.e_field = (SField *)sfLedgerIndex;
  local_18.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&item->elements,&local_18);
  local_28.e_field = (SField *)&sfLedgerEntryType;
  local_28.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_28);
  local_38.e_field = (SField *)sfFlags;
  local_38.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_38);
  return;
}

Assistant:

void LedgerFormats::addCommonFields (Item& item)
{
    item
        << SOElement(sfLedgerIndex,             SOE_OPTIONAL)
        << SOElement(sfLedgerEntryType,         SOE_REQUIRED)
        << SOElement(sfFlags,                   SOE_REQUIRED)
        ;
}